

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall cmFindLibraryHelper::AddName(cmFindLibraryHelper *this,string *name)

{
  char *exp;
  allocator local_141;
  undefined1 local_140 [8];
  string regex;
  undefined1 local_110 [8];
  Name entry;
  string *name_local;
  cmFindLibraryHelper *this_local;
  
  entry.Regex.searchstring = (char *)name;
  Name::Name((Name *)local_110);
  local_110[0] = HasValidSuffix(this,(string *)entry.Regex.searchstring);
  std::__cxx11::string::operator=((string *)&entry,(string *)entry.Regex.searchstring);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_140,"^",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::operator+=((string *)local_140,(string *)&this->PrefixRegexStr);
  RegexFromLiteral(this,(string *)local_140,(string *)entry.Regex.searchstring);
  std::__cxx11::string::operator+=((string *)local_140,(string *)&this->SuffixRegexStr);
  if ((this->OpenBSD & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_140,"(\\.[0-9]+\\.[0-9]+)?");
  }
  std::__cxx11::string::operator+=((string *)local_140,"$");
  exp = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::compile((RegularExpression *)((long)&entry.Raw.field_2 + 8),exp);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::push_back
            (&this->Names,(value_type *)local_110);
  std::__cxx11::string::~string((string *)local_140);
  Name::~Name((Name *)local_110);
  return;
}

Assistant:

void cmFindLibraryHelper::AddName(std::string const& name)
{
  Name entry;

  // Consider checking the raw name too.
  entry.TryRaw = this->HasValidSuffix(name);
  entry.Raw = name;

  // Build a regular expression to match library names.
  std::string regex = "^";
  regex += this->PrefixRegexStr;
  this->RegexFromLiteral(regex, name);
  regex += this->SuffixRegexStr;
  if(this->OpenBSD)
    {
    regex += "(\\.[0-9]+\\.[0-9]+)?";
    }
  regex += "$";
  entry.Regex.compile(regex.c_str());
  this->Names.push_back(entry);
}